

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O2

int __thiscall
sptk::reaper::FdFilter::FilterArray
          (FdFilter *this,int16_t *input,int nIn,bool first,bool last,int16_t *output,
          int max_to_output)

{
  int16_t iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined7 in_register_00000009;
  int16_t *piVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int available;
  int local_34;
  
  if ((int)CONCAT71(in_register_00000009,first) == 0) {
    iVar7 = this->array_leftover_;
    if (iVar7 != 0) {
      iVar6 = max_to_output;
      if (iVar7 < max_to_output) {
        iVar6 = iVar7;
      }
      iVar4 = this->array_index_;
      lVar9 = 0;
      iVar12 = 0;
      if (0 < iVar6) {
        iVar12 = iVar6;
      }
      piVar5 = this->output_buffer_;
      for (; iVar12 != (int)lVar9; lVar9 = lVar9 + 1) {
        *output = piVar5[iVar4 + lVar9];
        output = output + 1;
      }
      iVar12 = max_to_output - iVar6;
      this->array_leftover_ = iVar7 - iVar6;
      this->array_index_ = iVar4 + (int)lVar9;
      goto LAB_0010fee6;
    }
  }
  else {
    this->filter_state_ = 1;
    this->array_leftover_ = 0;
    this->array_index_ = 0;
  }
  iVar6 = 0;
  iVar12 = max_to_output;
LAB_0010fee6:
  iVar7 = nIn;
  if (iVar12 < 1) {
    nIn = 0;
  }
  else {
    do {
      max_to_output = iVar6;
      if (iVar7 < 1) goto LAB_00110000;
      iVar6 = this->max_input_;
      if (iVar7 < this->max_input_) {
        iVar6 = iVar7;
      }
      iVar4 = this->insert_;
      iVar8 = 0;
      if (0 < iVar6) {
        iVar8 = iVar6;
      }
      piVar5 = this->input_buffer_;
      if (iVar4 < 2) {
        for (lVar9 = 0; iVar8 != (int)lVar9; lVar9 = lVar9 + 1) {
          iVar1 = *input;
          input = input + 1;
          piVar5[lVar9] = iVar1;
        }
      }
      else {
        for (iVar11 = 0; iVar11 != iVar8; iVar11 = iVar11 + 1) {
          *piVar5 = *input;
          iVar3 = iVar4;
          while( true ) {
            iVar3 = iVar3 + -1;
            piVar5 = piVar5 + 1;
            if (iVar3 == 0) break;
            *piVar5 = 0;
          }
          input = input + 1;
        }
      }
      iVar8 = iVar7 - iVar6;
      if ((iVar8 == 0 || iVar7 < iVar6) && last) {
        *(byte *)&this->filter_state_ = (byte)this->filter_state_ | 2;
      }
      FilterBuffer(this,iVar6 * iVar4,&local_34);
      this->filter_state_ = 0;
      iVar7 = iVar12;
      if (local_34 < iVar12) {
        iVar7 = local_34;
      }
      piVar5 = this->output_buffer_;
      iVar4 = 0;
      if (0 < iVar7) {
        iVar4 = iVar7;
      }
      for (uVar10 = 0; (uint)(iVar4 * 2) != uVar10; uVar10 = uVar10 + 2) {
        *(undefined2 *)((long)output + uVar10) = *(undefined2 *)((long)piVar5 + uVar10);
      }
      max_to_output = max_to_output + iVar7;
      output = (int16_t *)((long)output + uVar10);
      iVar11 = local_34 - iVar7;
      bVar2 = local_34 < iVar7;
      iVar7 = iVar8;
      local_34 = iVar11;
      iVar6 = max_to_output;
    } while (iVar11 == 0 || bVar2);
    this->array_leftover_ = iVar11;
    this->array_index_ = iVar4;
    nIn = nIn - iVar8;
  }
LAB_00110000:
  this->array_samples_used_ = nIn;
  return max_to_output;
}

Assistant:

int FdFilter::FilterArray(int16_t *input, int nIn, bool first, bool last,
                          int16_t *output, int max_to_output) {
  int i, j, nLeft = nIn, nOut = 0, nToGo = max_to_output;
  int  toRead, toWrite, available;
  int16_t *p = input, *q, *r = output;

  if (first) {
    filter_state_ = 1;  // indicate start of new signal
    array_leftover_ = 0;
    array_index_ = 0;
  }
  if (array_leftover_) {  // First, move any output remaining from the
                         // previous call.
    int toCopy = array_leftover_;
    if (toCopy > nToGo)
      toCopy = nToGo;
    for (i = array_index_, j = 0; j < toCopy; i++, j++)
      *r++ = output_buffer_[i];
    nToGo -= toCopy;
    nOut += toCopy;
    array_leftover_ -= toCopy;
    array_index_ = i;
  }

  if (nToGo <= 0) {
    array_samples_used_ = 0;  // Can't process any input this time; no
                             // room in output array.
    return max_to_output;
  }

  /* Process data from array to array. */
  while (nLeft > 0) {
    toRead = nLeft;
    if (toRead > max_input_)
      toRead = max_input_;
    if (insert_ > 1) {
      for (q = input_buffer_, i = 0; i < toRead; i++) {
        *q++ = *p++;
        for (j = 1; j < insert_; j++)
          *q++ = 0;
      }
    } else {
      for (q = input_buffer_, i = 0; i < toRead; i++)
        *q++ = *p++;
    }
    nLeft -= toRead;
    if ((nLeft <= 0) && last)
      filter_state_ |= 2;  // Indicate that end of signal is (also) in
                           // this bufferful.
    FilterBuffer(toRead * insert_, &available);
    filter_state_ = 0;  // Clear the initialization bit, if any for the
                       // next iteration.

    toWrite = available;
    if (toWrite > nToGo)
      toWrite = nToGo;

    for (i = 0; i < toWrite; i++)
      *r++ = output_buffer_[i];
    nOut += toWrite;
    available -= toWrite;
    if (available > 0) {  // Ran out of output space; suspend processing
      array_leftover_ = available;  // Save the remaining output
                                    // samples for the next call.
      array_index_ = i;
      array_samples_used_ = nIn - nLeft;  // Record the number of input
                                         // samples actually used.
      return(nOut);
    }
  }
  array_samples_used_ = nIn;
  return(nOut);
}